

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

bool vkb::detail::check_extensions_supported
               (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                *available_extensions,
               vector<const_char_*,_std::allocator<const_char_*>_> *extension_names)

{
  pointer ppcVar1;
  bool bVar2;
  bool bVar3;
  char **extension_name;
  pointer ppcVar4;
  
  ppcVar1 = (extension_names->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  bVar3 = true;
  for (ppcVar4 = (extension_names->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppcVar4 != ppcVar1; ppcVar4 = ppcVar4 + 1
      ) {
    bVar2 = check_extension_supported(available_extensions,*ppcVar4);
    bVar3 = (bool)(bVar3 & bVar2);
  }
  return bVar3;
}

Assistant:

bool check_extensions_supported(
    std::vector<VkExtensionProperties> const& available_extensions, std::vector<const char*> const& extension_names) {
    bool all_found = true;
    for (const auto& extension_name : extension_names) {
        bool found = check_extension_supported(available_extensions, extension_name);
        if (!found) all_found = false;
    }
    return all_found;
}